

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O2

unsigned_short __thiscall Deserializer::peek<unsigned_short>(Deserializer *this)

{
  if ((*(int *)(this + 8) - (int)*(unsigned_short **)this & 0xfffffffeU) != 0) {
    return **(unsigned_short **)this;
  }
  return 0;
}

Assistant:

T peek() const {
    T value = 0;
    const uint8_t *temp_ptr = read_ptr;
    if (static_cast<unsigned>(end_ptr - temp_ptr) >= sizeof(T)) {
      for (auto i = 0u; i < sizeof(T); i++) {
        value |= static_cast<T>(*(temp_ptr++)) << static_cast<T>(8 * i);
      }
    }
    return value;
  }